

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdesktopunixservices.cpp
# Opt level: O0

void __thiscall QDesktopUnixServices::~QDesktopUnixServices(QDesktopUnixServices *this)

{
  QDBusPendingCallWatcher *pQVar1;
  QPlatformServices *in_RDI;
  
  in_RDI->_vptr_QPlatformServices = (_func_int **)&PTR__QDesktopUnixServices_00e250b0;
  pQVar1 = ::QPointer::operator_cast_to_QDBusPendingCallWatcher_
                     ((QPointer<QDBusPendingCallWatcher> *)0xac7fcd);
  if (pQVar1 != (QDBusPendingCallWatcher *)0x0) {
    (**(code **)(*(long *)pQVar1 + 0x20))();
  }
  QPointer<QDBusPendingCallWatcher>::~QPointer((QPointer<QDBusPendingCallWatcher> *)0xac7ff0);
  QString::~QString((QString *)0xac7ffd);
  QString::~QString((QString *)0xac800a);
  QPlatformServices::~QPlatformServices(in_RDI);
  return;
}

Assistant:

QDesktopUnixServices::~QDesktopUnixServices()
{
#if QT_CONFIG(dbus)
    delete m_watcher;
#endif
}